

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  int iVar2;
  char *zSql_00;
  void *pvVar3;
  u8 enc;
  ulong uVar4;
  int iVar5;
  char *zTail8;
  void **local_38;
  
  enc = (u8)prepFlags;
  zTail8 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql != (void *)0x0) && (iVar1 != 0)) {
    uVar4 = (ulong)(uint)nBytes;
    if (-1 < nBytes) {
      for (uVar4 = 0;
          (uVar4 < (uint)nBytes &&
          ((*(char *)((long)zSql + uVar4) != '\0' || (*(char *)((long)zSql + uVar4 + 1) != '\0'))));
          uVar4 = uVar4 + 2) {
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    zSql_00 = sqlite3Utf16to8(db,zSql,(int)uVar4,enc);
    if (zSql_00 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3LockAndPrepare(db,zSql_00,-1,prepFlags,(Vdbe *)0x0,ppStmt,&zTail8);
      local_38 = pzTail;
      if (pzTail != (void **)0x0 && zTail8 != (char *)0x0) {
        iVar2 = sqlite3Utf8CharLen(zSql_00,(int)zTail8 - (int)zSql_00);
        pvVar3 = zSql;
        iVar5 = 0;
        if (0 < iVar2) {
          iVar5 = iVar2;
        }
        while (iVar5 != 0) {
          pvVar3 = (void *)((long)pvVar3 +
                           (ulong)((*(byte *)((long)pvVar3 + 1) & 0xf8) == 0xd8) * 2 + 2);
          iVar5 = iVar5 + -1;
        }
        *local_38 = (void *)((long)((int)pvVar3 - (int)zSql) + (long)zSql);
      }
    }
    sqlite3DbFree(db,zSql_00);
    iVar1 = sqlite3ApiExit(db,iVar1);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar1;
  }
  iVar1 = sqlite3MisuseError(0x1e67d);
  return iVar1;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */ 
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8); 
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}